

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void mp::
     WriteAlgCon<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::MutAlgebraicCon,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,MutAlgebraicCon *con,VarNamer vnam)

{
  double value;
  long lVar1;
  BasicWriter<char> *pBVar2;
  NumericExpr nonlinear;
  long lVar3;
  char *pcVar4;
  double value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  size_t sStack_40;
  
  lVar1 = (long)(con->
                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  lVar3 = (long)(((con->
                  super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_
                 )->algebraic_cons_).
                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  value = *(double *)(lVar3 + 0x78 + lVar1 * 0x88);
  value_00 = *(double *)(lVar3 + 0x80 + lVar1 * 0x88);
  if ((value_00 < INFINITY) && (-INFINITY < value)) {
    if ((value != value_00) || (NAN(value) || NAN(value_00))) {
      pBVar2 = fmt::BasicWriter<char>::operator<<(w,value);
      value_01.size_ = 4;
      value_01.data_ = " <= ";
      fmt::BasicWriter<char>::operator<<(pBVar2,value_01);
      lVar1 = (long)(con->
                    super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
      ;
      lVar3 = (long)(((con->
                      super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->algebraic_cons_).
                    super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  nonlinear = BasicProblem<mp::BasicProblemParams<int>_>::
              BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::nonlinear_expr(&con->
                                super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                              );
  WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
            (w,(LinearExpr *)(lVar1 * 0x88 + lVar3),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)nonlinear.super_ExprBase.impl_,vnam);
  if ((value != value_00) || (NAN(value) || NAN(value_00))) {
    if (value_00 < INFINITY) {
      value_03.size_ = 4;
      value_03.data_ = " <= ";
      pBVar2 = fmt::BasicWriter<char>::operator<<(w,value_03);
      goto LAB_00140a7a;
    }
    if (value <= -INFINITY) {
      return;
    }
    pcVar4 = " >= ";
    sStack_40 = 4;
  }
  else {
    pcVar4 = " = ";
    sStack_40 = 3;
  }
  value_02.size_ = sStack_40;
  value_02.data_ = pcVar4;
  pBVar2 = fmt::BasicWriter<char>::operator<<(w,value_02);
  value_00 = value;
LAB_00140a7a:
  fmt::BasicWriter<char>::operator<<(pBVar2,value_00);
  return;
}

Assistant:

void WriteAlgCon(fmt::Writer &w,
                 const AlgCon &con, VN vnam) {
  double inf = INFINITY;
  double lb = con.lb(), ub = con.ub();
  if (lb != ub && lb != -inf && ub != inf)
    w << lb << " <= ";
  WriteExpr<ExprTypes>(
        w, con.linear_expr(), con.nonlinear_expr(), vnam);
  if (lb == ub)
    w << " = " << lb;
  else if (ub != inf)
    w << " <= " << ub;
  else if (lb != -inf)
    w << " >= " << lb;
}